

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

uint32_t c_v256_movemask_8(c_v256 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5 = vpsrlw_avx((undefined1  [16])a.v128[1],7);
  auVar6[8] = 1;
  auVar6._0_8_ = 0x101010101010101;
  auVar6[9] = 1;
  auVar6[10] = 1;
  auVar6[0xb] = 1;
  auVar6[0xc] = 1;
  auVar6[0xd] = 1;
  auVar6[0xe] = 1;
  auVar6[0xf] = 1;
  auVar5 = vpand_avx(auVar5,auVar6);
  auVar1 = vpshufd_avx(auVar5,0xee);
  auVar3 = vpmovzxbd_avx2(auVar1);
  auVar4 = vpmovzxbd_avx2(auVar5);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_00c246c0);
  auVar3 = vpsllvd_avx2(auVar3,_DAT_00c246e0);
  auVar4 = vpor_avx2(auVar4,auVar3);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = a.u64[1];
  auVar5 = vpsrlw_avx(auVar5,7);
  auVar5 = vpand_avx(auVar5,auVar6);
  auVar3 = vpmovzxbd_avx2(auVar5);
  auVar3 = vpsllvd_avx2(auVar3,_DAT_00c24700);
  auVar5 = vpmovzxbw_avx(ZEXT416((uint)a.u64[0]._3_4_));
  auVar5 = vpmullw_avx(auVar5,_DAT_00c24720);
  auVar5 = vpsrlw_avx(auVar5,8);
  auVar5 = vpackuswb_avx(auVar5,auVar5);
  auVar5 = vpand_avx(auVar5,_DAT_00c24ac0);
  auVar1 = vpor_avx(auVar4._0_16_,auVar4._16_16_);
  auVar6 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar6);
  auVar6 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar6);
  auVar6 = vpor_avx(auVar3._0_16_,auVar3._16_16_);
  auVar2 = vpshufd_avx(auVar6,0xee);
  auVar6 = vpor_avx(auVar6,auVar2);
  auVar2 = vpshufd_avx(auVar6,0x55);
  auVar6 = vpor_avx(auVar6,auVar2);
  auVar5 = vpmovzxbd_avx(auVar5);
  auVar2 = vpshufd_avx(auVar5,0xee);
  auVar5 = vpor_avx(auVar5,auVar2);
  auVar2 = vpshufd_avx(auVar5,0x55);
  auVar5 = vpor_avx(auVar5,auVar2);
  return auVar5._0_4_ |
         auVar6._0_4_ | auVar1._0_4_ | a.u8[7] & 0xffffff80 | a.u8[1] >> 6 & 2 | a.u8[2] >> 5 & 4 |
         (uint)(a.u8[0] >> 7);
}

Assistant:

SIMD_INLINE uint32_t c_v256_movemask_8(c_v256 a) {
  return ((uint32_t)(a.s8[31] < 0) << 31) | ((a.s8[30] < 0) << 30) |
         ((a.s8[29] < 0) << 29) | ((a.s8[28] < 0) << 28) |
         ((a.s8[27] < 0) << 27) | ((a.s8[26] < 0) << 26) |
         ((a.s8[25] < 0) << 25) | ((a.s8[24] < 0) << 24) |
         ((a.s8[23] < 0) << 23) | ((a.s8[22] < 0) << 22) |
         ((a.s8[21] < 0) << 21) | ((a.s8[20] < 0) << 20) |
         ((a.s8[19] < 0) << 19) | ((a.s8[18] < 0) << 18) |
         ((a.s8[17] < 0) << 17) | ((a.s8[16] < 0) << 16) |
         ((a.s8[15] < 0) << 15) | ((a.s8[14] < 0) << 14) |
         ((a.s8[13] < 0) << 13) | ((a.s8[12] < 0) << 12) |
         ((a.s8[11] < 0) << 11) | ((a.s8[10] < 0) << 10) |
         ((a.s8[9] < 0) << 9) | ((a.s8[8] < 0) << 8) | ((a.s8[7] < 0) << 7) |
         ((a.s8[6] < 0) << 6) | ((a.s8[5] < 0) << 5) | ((a.s8[4] < 0) << 4) |
         ((a.s8[3] < 0) << 3) | ((a.s8[2] < 0) << 2) | ((a.s8[1] < 0) << 1) |
         ((a.s8[0] < 0) << 0);
}